

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestInfo::Skip(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *this_00;
  TestPartResultReporterInterface *pTVar2;
  TestPartResult test_part_result;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(&UnitTest::GetInstance::instance,this);
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[8])(pTVar1,this);
    TestPartResult::TestPartResult
              (&test_part_result,kSkip,(this->location_).file._M_dataplus._M_p,
               (this->location_).line,"");
    this_00 = internal::GetUnitTestImpl();
    pTVar2 = internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread(this_00);
    (*pTVar2->_vptr_TestPartResultReporterInterface[2])(pTVar2,&test_part_result);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1);
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(&UnitTest::GetInstance::instance,(TestInfo *)0x0);
    TestPartResult::~TestPartResult(&test_part_result);
  }
  return;
}

Assistant:

void TestInfo::Skip() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TestPartResult test_part_result =
      TestPartResult(TestPartResult::kSkip, this->file(), this->line(), "");
  internal::GetUnitTestImpl()
      ->GetTestPartResultReporterForCurrentThread()
      ->ReportTestPartResult(test_part_result);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);
  UnitTest::GetInstance()->set_current_test_info(nullptr);
}